

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler.hpp
# Opt level: O0

FailCodeType __thiscall
mittens::
GenericExceptionHandler<std::exception,_mittens::GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/examples/2_custom_app_return_codes_with_messages.cpp:18:42)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/examples/2_custom_app_return_codes_with_messages.cpp:17:42)>
::runAction(GenericExceptionHandler<std::exception,_mittens::GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_examples_2_custom_app_return_codes_with_messages_cpp:18:42)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_examples_2_custom_app_return_codes_with_messages_cpp:17:42)>
            *this,exception *e)

{
  exception *e_local;
  GenericExceptionHandler<std::exception,_mittens::GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_examples_2_custom_app_return_codes_with_messages_cpp:18:42)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_examples_2_custom_app_return_codes_with_messages_cpp:17:42)>
  *this_local;
  
  main::$_1::operator()((__1 *)&this->field_0xc,e);
  return this->failCode_;
}

Assistant:

FailCodeType runAction(ExceptionType& e, std::false_type)
      {
         customAction_(e);
         return failCode_;
      }